

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_bitmap_intersect(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  undefined1 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  art_iterator_t *key;
  ulong uVar6;
  art_iterator_t *iterator;
  art_iterator_t it2;
  art_iterator_t it1;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  art_init_iterator(&local_c0,&r1->art,true);
  art_init_iterator(&local_150,&r2->art,true);
  if ((local_c0.value != (ulong *)0x0) && (local_150.value != (ulong *)0x0)) {
    do {
      iVar2 = art_compare_keys(local_c0.key,local_150.key);
      if (iVar2 == 0) {
        uVar3 = *local_c0.value;
        if ((char)uVar3 == '\x04') {
          uVar3 = (ulong)*(byte *)((long)r1->containers[uVar3 >> 8] + 8);
        }
        uVar4 = *local_150.value;
        uVar6 = uVar4 >> 8;
        plVar5 = (long *)r2->containers[uVar6];
        if ((char)uVar4 == '\x04') {
          uVar4 = (ulong)*(byte *)(plVar5 + 1);
          plVar5 = (long *)*plVar5;
        }
        uVar1 = (*(code *)(&DAT_0012f5bc +
                          *(int *)(&DAT_0012f5bc +
                                  (ulong)(((int)(uVar4 & 0xff) + ((uint)uVar3 & 0xff) * 4) - 5) * 4)
                          ))(uVar6,plVar5,uVar4 & 0xff,
                             &DAT_0012f5bc +
                             *(int *)(&DAT_0012f5bc +
                                     (ulong)(((int)(uVar4 & 0xff) + ((uint)uVar3 & 0xff) * 4) - 5) *
                                     4));
        return (_Bool)uVar1;
      }
      key = &local_150;
      iterator = &local_c0;
      if (-1 < iVar2) {
        key = &local_c0;
        iterator = &local_150;
      }
      art_iterator_lower_bound(iterator,key->key);
    } while ((local_c0.value != (ulong *)0x0) && (local_150.value != (ulong *)0x0));
  }
  return false;
}

Assistant:

bool roaring64_bitmap_intersect(const roaring64_bitmap_t *r1,
                                const roaring64_bitmap_t *r2) {
    bool intersect = false;
    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL && it2.value != NULL) {
        // Cases:
        // 1. it1 <  it2 -> it1++
        // 2. it1 == it1 -> intersect |= it1 & it2, it1++, it2++
        // 3. it1 >  it2 -> it2++
        int compare_result = compare_high48(it1.key, it2.key);
        if (compare_result == 0) {
            // Case 2: iterators at the same high key position.
            leaf_t leaf1 = (leaf_t)*it1.value;
            leaf_t leaf2 = (leaf_t)*it2.value;
            intersect |= container_intersect(
                get_container(r1, leaf1), get_typecode(leaf1),
                get_container(r2, leaf2), get_typecode(leaf2));
            art_iterator_next(&it1);
            art_iterator_next(&it2);
        } else if (compare_result < 0) {
            // Case 1: it1 is before it2.
            art_iterator_lower_bound(&it1, it2.key);
        } else {
            // Case 3: it2 is before it1.
            art_iterator_lower_bound(&it2, it1.key);
        }
    }
    return intersect;
}